

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

Inst * __thiscall mir::inst::StoreInst::deep_copy(StoreInst *this)

{
  uint32_t uVar1;
  Inst *pIVar2;
  _Array_type *__vtable;
  anon_class_8_1_a78179b7_conflict local_50;
  undefined **local_48;
  VarId local_40;
  char local_30;
  undefined2 local_2f;
  
  pIVar2 = (Inst *)operator_new(0x38);
  local_30 = (this->val).field_0x18;
  local_50.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_40;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_30 + 1]._M_data)
            (&local_50,(variant<int,_mir::inst::VarId> *)&(this->val).field_0x8);
  local_48 = &PTR_display_001effc8;
  local_2f._0_1_ = (this->val).shift;
  local_2f._1_1_ = (this->val).shift_amount;
  uVar1 = (this->super_Inst).dest.id;
  (pIVar2->dest).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  (pIVar2->dest).id = uVar1;
  (pIVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001f02b8;
  local_50.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&pIVar2[1].dest;
  *(undefined1 *)&pIVar2[2].super_Displayable._vptr_Displayable = 0xff;
  *(char *)&pIVar2[2].super_Displayable._vptr_Displayable = local_30;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_30 + 1]._M_data)
            (&local_50,(variant<int,_mir::inst::VarId> *)&local_40);
  pIVar2[1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
  *(undefined2 *)((long)&pIVar2[2].super_Displayable._vptr_Displayable + 1) = local_2f;
  return pIVar2;
}

Assistant:

Inst* deep_copy() { return new StoreInst(val, dest); }